

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyUtils.cpp
# Opt level: O3

bool isGlobalName(string *name,string *curFun)

{
  pointer pcVar1;
  pair<bool,_int> pVar2;
  string local_58;
  string local_38;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
  pcVar1 = (curFun->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + curFun->_M_string_length);
  pVar2 = SymbolTable::getAddr(&symbolTable,&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return (bool)(pVar2.first & 1);
}

Assistant:

bool isGlobalName(string name, string curFun)
{

    return symbolTable.getAddr(name, curFun).first;
}